

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void * cmGetSource(void *arg,char *name)

{
  cmSourceFile *pcVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>,_bool>
  pVar4;
  __single_object sf;
  cmSourceFile *rsf;
  _Head_base<0UL,_cmCPluginAPISourceFile_*,_false> local_40;
  cmSourceFile *local_38;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,name,(allocator<char> *)&local_40);
  pcVar1 = cmMakefile::GetSource((cmMakefile *)arg,&local_30,Ambiguous);
  std::__cxx11::string::~string((string *)&local_30);
  if (pcVar1 == (cmSourceFile *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    local_38 = pcVar1;
    iVar2 = std::
            _Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>,_std::_Select1st<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>_>
            ::find(&cmCPluginAPISourceFiles._M_t,&local_38);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header) {
      std::make_unique<cmCPluginAPISourceFile>();
      (local_40._M_head_impl)->RealSourceFile = local_38;
      cmSourceFile::ResolveFullPath(local_38,(string *)0x0,(string *)0x0);
      std::__cxx11::string::_M_assign((string *)&(local_40._M_head_impl)->FullPath);
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                (&local_30,&(local_40._M_head_impl)->FullPath);
      std::__cxx11::string::operator=
                ((string *)&(local_40._M_head_impl)->SourceName,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      cmsys::SystemTools::GetFilenameLastExtension(&local_30,&(local_40._M_head_impl)->FullPath);
      std::__cxx11::string::operator=
                ((string *)&(local_40._M_head_impl)->SourceExtension,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      pVar4 = std::
              _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
              ::
              _M_emplace_unique<cmSourceFile*&,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>
                        ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
                          *)&cmCPluginAPISourceFiles,&local_38,
                         (unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                          *)&local_40);
      iVar2._M_node = (_Base_ptr)pVar4.first._M_node;
      std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>::
      ~unique_ptr((unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                   *)&local_40);
    }
    p_Var3 = iVar2._M_node[1]._M_parent;
  }
  return p_Var3;
}

Assistant:

static void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    auto i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      auto sf = cm::make_unique<cmCPluginAPISourceFile>();
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->ResolveFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be re-used and deleted later.
      i = cmCPluginAPISourceFiles.emplace(rsf, std::move(sf)).first;
    }
    return i->second.get();
  }
  return nullptr;
}